

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_lib.c
# Opt level: O0

int OSSL_DECODER_from_bio(OSSL_DECODER_CTX *ctx,BIO *in)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  BIO_METHOD *type;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  BIO *in_RSI;
  long *in_RDI;
  bool bVar9;
  char *input_structure;
  char *input_type;
  char *comma;
  char *input_structure_label;
  char *input_type_label;
  char *spaces;
  unsigned_long lasterr;
  BIO *new_bio;
  int ok;
  decoder_process_data_st data;
  OSSL_DECODER_CTX *in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  int line;
  char *in_stack_ffffffffffffff60;
  char *pcVar10;
  char *file;
  char *local_98;
  BIO *local_50;
  int local_44;
  long *local_40;
  BIO *local_38;
  byte local_20;
  BIO *local_18;
  long *local_10;
  
  line = (int)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  local_50 = (BIO *)0x0;
  if (in_RSI == (BIO *)0x0) {
    ERR_new();
    ERR_set_debug(in_stack_ffffffffffffff60,line,in_stack_ffffffffffffff50);
    ERR_set_error(0x3c,0xc0102,(char *)0x0);
    return 0;
  }
  local_18 = in_RSI;
  local_10 = in_RDI;
  iVar1 = OSSL_DECODER_CTX_get_num_decoders(in_stack_ffffffffffffff48);
  if (iVar1 != 0) {
    uVar2 = ERR_peek_last_error();
    lVar3 = BIO_ctrl(local_18,0x85,0,(void *)0x0);
    if ((int)lVar3 < 0) {
      type = BIO_f_readbuffer();
      local_50 = BIO_new((BIO_METHOD *)type);
      if (local_50 == (BIO *)0x0) {
        return 0;
      }
      local_18 = BIO_push(local_50,local_18);
    }
    memset(&local_40,0,0x28);
    local_40 = local_10;
    local_38 = local_18;
    ossl_pw_enable_passphrase_caching((ossl_passphrase_data_st *)(local_10 + 7));
    local_44 = decoder_process((OSSL_PARAM *)data.bio,data.ctx);
    if ((local_20 >> 1 & 1) == 0) {
      bVar9 = false;
      if (*local_10 != 0) {
        bVar9 = local_10[1] != 0;
      }
      pcVar4 = "";
      if (bVar9) {
        pcVar4 = " ";
      }
      pcVar5 = "";
      if (*local_10 != 0) {
        pcVar5 = "Input type: ";
      }
      pcVar6 = "";
      if (local_10[1] != 0) {
        pcVar6 = "Input structure: ";
      }
      bVar9 = false;
      if (*local_10 != 0) {
        bVar9 = local_10[1] != 0;
      }
      pcVar7 = "";
      if (bVar9) {
        pcVar7 = ", ";
      }
      if (*local_10 == 0) {
        local_98 = "";
      }
      else {
        local_98 = (char *)*local_10;
      }
      if (local_10[1] == 0) {
        pcVar10 = "";
      }
      else {
        pcVar10 = (char *)local_10[1];
      }
      file = pcVar10;
      uVar8 = ERR_peek_last_error();
      if ((uVar8 == uVar2) || (uVar2 = ERR_peek_error(), uVar2 == 0)) {
        ERR_new();
        ERR_set_debug(file,line,in_stack_ffffffffffffff50);
        ERR_set_error(0x3c,0x8010c,"No supported data to decode. %s%s%s%s%s%s",pcVar4,pcVar5,
                      local_98,pcVar7,pcVar6,pcVar10);
      }
      local_44 = 0;
    }
    ossl_pw_clear_passphrase_cache((ossl_passphrase_data_st *)0x408dac);
    if (local_50 != (BIO *)0x0) {
      BIO_pop(local_50);
      BIO_free(local_50);
    }
    return local_44;
  }
  ERR_new();
  ERR_set_debug(in_stack_ffffffffffffff60,line,in_stack_ffffffffffffff50);
  ERR_set_error(0x3c,0x66,
                "No decoders were found. For standard decoders you need at least one of the default or base providers available. Did you forget to load them?"
               );
  return 0;
}

Assistant:

int OSSL_DECODER_from_bio(OSSL_DECODER_CTX *ctx, BIO *in)
{
    struct decoder_process_data_st data;
    int ok = 0;
    BIO *new_bio = NULL;
    unsigned long lasterr;

    if (in == NULL) {
        ERR_raise(ERR_LIB_OSSL_DECODER, ERR_R_PASSED_NULL_PARAMETER);
        return 0;
    }

    if (OSSL_DECODER_CTX_get_num_decoders(ctx) == 0) {
        ERR_raise_data(ERR_LIB_OSSL_DECODER, OSSL_DECODER_R_DECODER_NOT_FOUND,
                       "No decoders were found. For standard decoders you need "
                       "at least one of the default or base providers "
                       "available. Did you forget to load them?");
        return 0;
    }

    lasterr = ERR_peek_last_error();

    if (BIO_tell(in) < 0) {
        new_bio = BIO_new(BIO_f_readbuffer());
        if (new_bio == NULL)
            return 0;
        in = BIO_push(new_bio, in);
    }
    memset(&data, 0, sizeof(data));
    data.ctx = ctx;
    data.bio = in;

    /* Enable passphrase caching */
    (void)ossl_pw_enable_passphrase_caching(&ctx->pwdata);

    ok = decoder_process(NULL, &data);

    if (!data.flag_construct_called) {
        const char *spaces
            = ctx->start_input_type != NULL && ctx->input_structure != NULL
            ? " " : "";
        const char *input_type_label
            = ctx->start_input_type != NULL ? "Input type: " : "";
        const char *input_structure_label
            = ctx->input_structure != NULL ? "Input structure: " : "";
        const char *comma
            = ctx->start_input_type != NULL && ctx->input_structure != NULL
            ? ", " : "";
        const char *input_type
            = ctx->start_input_type != NULL ? ctx->start_input_type : "";
        const char *input_structure
            = ctx->input_structure != NULL ? ctx->input_structure : "";

        if (ERR_peek_last_error() == lasterr || ERR_peek_error() == 0)
            /* Prevent spurious decoding error but add at least something */
            ERR_raise_data(ERR_LIB_OSSL_DECODER, ERR_R_UNSUPPORTED,
                           "No supported data to decode. %s%s%s%s%s%s",
                           spaces, input_type_label, input_type, comma,
                           input_structure_label, input_structure);
        ok = 0;
    }

    /* Clear any internally cached passphrase */
    (void)ossl_pw_clear_passphrase_cache(&ctx->pwdata);

    if (new_bio != NULL) {
        BIO_pop(new_bio);
        BIO_free(new_bio);
    }
    return ok;
}